

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto3_arena_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::Proto3ArenaTest_ReleaseMessage_Test::
~Proto3ArenaTest_ReleaseMessage_Test(Proto3ArenaTest_ReleaseMessage_Test *this)

{
  Proto3ArenaTest_ReleaseMessage_Test *this_local;
  
  ~Proto3ArenaTest_ReleaseMessage_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Proto3ArenaTest, ReleaseMessage) {
  Arena arena;
  TestAllTypes* arena_message = Arena::Create<TestAllTypes>(&arena);
  arena_message->mutable_optional_nested_message()->set_bb(118);
  std::unique_ptr<TestAllTypes::NestedMessage> nested(
      arena_message->release_optional_nested_message());
  EXPECT_EQ(118, nested->bb());
}